

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ptr_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::RawPtr_ClearIfNotDefault_Test::
RawPtr_ClearIfNotDefault_Test(RawPtr_ClearIfNotDefault_Test *this)

{
  RawPtr_ClearIfNotDefault_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__RawPtr_ClearIfNotDefault_Test_029e43a0;
  return;
}

Assistant:

TEST(RawPtr, ClearIfNotDefault) {
  struct ObjectWithClear {
    int called = 0;
    void Clear() { ++called; }
  };
  RawPtr<ObjectWithClear> raw;
  EXPECT_TRUE(raw.IsDefault());

  // Shouldn't trigger / crash
  raw.ClearIfNotDefault();
  EXPECT_EQ(raw.Get()->called, 0);

  raw.Set(new ObjectWithClear());
  EXPECT_FALSE(raw.IsDefault());

  // Should invoke Clear
  raw.ClearIfNotDefault();
  EXPECT_EQ(raw.Get()->called, 1);

  raw.DeleteIfNotDefault();
}